

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

int jmp_patchtestreg(FuncState *fs,BCPos pc,BCReg reg)

{
  char cVar1;
  uint uVar2;
  BCInsLine *pBVar3;
  uint local_3c;
  BCOp op;
  BCInsLine *ilp;
  BCReg reg_local;
  BCPos pc_local;
  FuncState *fs_local;
  
  if (pc == 0) {
    local_3c = 0;
  }
  else {
    local_3c = pc - 1;
  }
  pBVar3 = fs->bcbase + local_3c;
  uVar2 = pBVar3->ins & 0xff;
  cVar1 = (char)reg;
  if ((uVar2 == 0xc) || (uVar2 == 0xd)) {
    if ((reg == 0xff) || (reg == pBVar3->ins >> 0x10)) {
      *(char *)&pBVar3->ins = (char)pBVar3->ins + '\x02';
      *(undefined1 *)((long)&pBVar3->ins + 1) = 0;
    }
    else {
      *(char *)((long)&pBVar3->ins + 1) = cVar1;
    }
  }
  else {
    if ((pBVar3->ins >> 8 & 0xff) != 0xff) {
      return 0;
    }
    if (reg == 0xff) {
      pBVar3->ins = (fs->bcbase[pc].ins >> 8 & 0xff) << 8 | 0x80000058;
    }
    else {
      *(char *)((long)&pBVar3->ins + 1) = cVar1;
      if ((pBVar3[1].ins >> 8 & 0xff) <= reg) {
        *(char *)((long)&pBVar3[1].ins + 1) = cVar1 + '\x01';
      }
    }
  }
  return 1;
}

Assistant:

static int jmp_patchtestreg(FuncState *fs, BCPos pc, BCReg reg)
{
  BCInsLine *ilp = &fs->bcbase[pc >= 1 ? pc-1 : pc];
  BCOp op = bc_op(ilp->ins);
  if (op == BC_ISTC || op == BC_ISFC) {
    if (reg != NO_REG && reg != bc_d(ilp->ins)) {
      setbc_a(&ilp->ins, reg);
    } else {  /* Nothing to store or already in the right register. */
      setbc_op(&ilp->ins, op+(BC_IST-BC_ISTC));
      setbc_a(&ilp->ins, 0);
    }
  } else if (bc_a(ilp->ins) == NO_REG) {
    if (reg == NO_REG) {
      ilp->ins = BCINS_AJ(BC_JMP, bc_a(fs->bcbase[pc].ins), 0);
    } else {
      setbc_a(&ilp->ins, reg);
      if (reg >= bc_a(ilp[1].ins))
	setbc_a(&ilp[1].ins, reg+1);
    }
  } else {
    return 0;  /* Cannot patch other instructions. */
  }
  return 1;
}